

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

loader_impl loader_impl_allocate(char *tag)

{
  loader_impl __s;
  set psVar1;
  vector pvVar2;
  context pcVar3;
  set in_RDI;
  loader_impl impl;
  set_cb_hash in_stack_fffffffffffffff8;
  
  __s = (loader_impl)malloc(0x58);
  if (__s != (loader_impl)0x0) {
    memset(__s,0,0x58);
    psVar1 = set_create(in_stack_fffffffffffffff8,(set_cb_compare)in_RDI);
    __s->handle_impl_path_map = psVar1;
    if (__s->handle_impl_path_map != (set)0x0) {
      psVar1 = set_create(in_stack_fffffffffffffff8,(set_cb_compare)in_RDI);
      __s->handle_impl_map = psVar1;
      if (__s->handle_impl_map != (set)0x0) {
        pvVar2 = vector_create(0x12fbd9);
        __s->handle_impl_init_order = pvVar2;
        if (__s->handle_impl_init_order != (vector)0x0) {
          psVar1 = set_create(in_stack_fffffffffffffff8,(set_cb_compare)in_RDI);
          __s->type_info_map = psVar1;
          if (__s->type_info_map != (set)0x0) {
            pcVar3 = context_create((char *)in_stack_fffffffffffffff8);
            __s->ctx = pcVar3;
            if (__s->ctx != (context)0x0) {
              psVar1 = set_create(in_stack_fffffffffffffff8,(set_cb_compare)in_RDI);
              __s->exec_path_map = psVar1;
              if (__s->exec_path_map != (set)0x0) {
                return __s;
              }
              context_destroy((context)0x12fc84);
            }
            set_destroy(in_RDI);
          }
          vector_destroy((vector)0x12fc9e);
        }
        set_destroy(in_RDI);
      }
      set_destroy(in_RDI);
    }
    free(__s);
  }
  return (loader_impl)0x0;
}

Assistant:

loader_impl loader_impl_allocate(const loader_tag tag)
{
	loader_impl impl = malloc(sizeof(struct loader_impl_type));

	if (impl == NULL)
	{
		goto alloc_error;
	}

	memset(impl, 0, sizeof(struct loader_impl_type));

	impl->handle_impl_path_map = set_create(&hash_callback_str, &comparable_callback_str);

	if (impl->handle_impl_path_map == NULL)
	{
		goto alloc_handle_impl_path_map_error;
	}

	impl->handle_impl_map = set_create(&hash_callback_ptr, &comparable_callback_ptr);

	if (impl->handle_impl_map == NULL)
	{
		goto alloc_handle_impl_map_error;
	}

	impl->handle_impl_init_order = vector_create_type(loader_handle_impl);

	if (impl->handle_impl_init_order == NULL)
	{
		goto alloc_handle_impl_init_order_error;
	}

	impl->type_info_map = set_create(&hash_callback_str, &comparable_callback_str);

	if (impl->type_info_map == NULL)
	{
		goto alloc_type_info_map_error;
	}

	impl->ctx = context_create(tag);

	if (impl->ctx == NULL)
	{
		goto alloc_ctx_error;
	}

	impl->exec_path_map = set_create(&hash_callback_str, &comparable_callback_str);

	if (impl->exec_path_map == NULL)
	{
		goto alloc_exec_path_map_error;
	}

	return impl;

alloc_exec_path_map_error:
	context_destroy(impl->ctx);
alloc_ctx_error:
	set_destroy(impl->type_info_map);
alloc_type_info_map_error:
	vector_destroy(impl->handle_impl_init_order);
alloc_handle_impl_init_order_error:
	set_destroy(impl->handle_impl_map);
alloc_handle_impl_map_error:
	set_destroy(impl->handle_impl_path_map);
alloc_handle_impl_path_map_error:
	free(impl);
alloc_error:
	return NULL;
}